

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O2

bool DecompressScript(CScript *script,uint nSize,CompressedScript *in)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  CScript *pCVar5;
  long in_FS_OFFSET;
  CPubKey pubkey;
  uchar local_48;
  char *local_47;
  undefined8 uStack_3f;
  undefined8 local_37;
  undefined8 uStack_2f;
  uchar local_27 [7];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(nSize) {
  case 0:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,0x19);
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[0] = 'v';
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[1] = -0x57;
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[2] = '\x14';
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (0x21 < in->_size) {
      in = (CompressedScript *)(in->_union).indirect_contents.indirect;
    }
    *(undefined4 *)((long)&(pCVar5->super_CScriptBase)._union + 0x13) =
         *(undefined4 *)((long)&in->_union + 0x10);
    uVar2 = *(undefined8 *)((long)&in->_union + 8);
    *(char **)((long)&(pCVar5->super_CScriptBase)._union.indirect_contents.indirect + 3) =
         (in->_union).indirect_contents.indirect;
    *(undefined8 *)((long)&(pCVar5->super_CScriptBase)._union + 0xb) = uVar2;
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[0x17] = -0x78;
    if (0x1c < (script->super_CScriptBase)._size) {
      script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (script->super_CScriptBase)._union.direct[0x18] = -0x54;
    break;
  case 1:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,0x17);
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[0] = -0x57;
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[1] = '\x14';
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (0x21 < in->_size) {
      in = (CompressedScript *)(in->_union).indirect_contents.indirect;
    }
    *(undefined4 *)((long)&(pCVar5->super_CScriptBase)._union + 0x12) =
         *(undefined4 *)((long)&in->_union + 0x10);
    uVar2 = *(undefined8 *)((long)&in->_union + 8);
    *(char **)((long)&(pCVar5->super_CScriptBase)._union.indirect_contents.indirect + 2) =
         (in->_union).indirect_contents.indirect;
    *(undefined8 *)((long)&(pCVar5->super_CScriptBase)._union + 10) = uVar2;
    if (0x1c < (script->super_CScriptBase)._size) {
      script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (script->super_CScriptBase)._union.direct[0x16] = -0x79;
    break;
  case 2:
  case 3:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,0x23);
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[0] = '!';
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    (pCVar5->super_CScriptBase)._union.direct[1] = (char)nSize;
    pCVar5 = script;
    if (0x1c < (script->super_CScriptBase)._size) {
      pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (0x21 < in->_size) {
      in = (CompressedScript *)(in->_union).indirect_contents.indirect;
    }
    pcVar1 = (in->_union).indirect_contents.indirect;
    uVar2 = *(undefined8 *)((long)&in->_union + 8);
    uVar3 = *(undefined8 *)((long)&in->_union + 0x18);
    *(undefined8 *)((long)&(pCVar5->super_CScriptBase)._union + 0x12) =
         *(undefined8 *)((long)&in->_union + 0x10);
    *(undefined8 *)((long)&(pCVar5->super_CScriptBase)._union + 0x1a) = uVar3;
    *(char **)((long)&(pCVar5->super_CScriptBase)._union.indirect_contents.indirect + 2) = pcVar1;
    *(undefined8 *)((long)&(pCVar5->super_CScriptBase)._union + 10) = uVar2;
    if (0x1c < (script->super_CScriptBase)._size) {
      script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    script[1].super_CScriptBase._union.direct[2] = -0x54;
    break;
  case 4:
  case 5:
    local_48 = (char)nSize + 0xfe;
    if (0x21 < in->_size) {
      in = (CompressedScript *)(in->_union).indirect_contents.indirect;
    }
    local_47 = (in->_union).indirect_contents.indirect;
    uStack_3f = *(undefined8 *)((long)&in->_union + 8);
    local_37 = *(undefined8 *)((long)&in->_union + 0x10);
    uStack_2f = *(undefined8 *)((long)&in->_union + 0x18);
    CPubKey::Set<unsigned_char_const*>(&pubkey,&local_48,local_27);
    bVar4 = CPubKey::Decompress(&pubkey);
    if (bVar4) {
      if ((((pubkey.vch[0] & 0xfe) == 2) || (7 < pubkey.vch[0])) ||
         ((0xd0U >> (pubkey.vch[0] & 0x1f) & 1) == 0)) {
        __assert_fail("pubkey.size() == 65",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/compressor.cpp"
                      ,0x82,
                      "bool DecompressScript(CScript &, unsigned int, const CompressedScript &)");
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,0x43);
      pCVar5 = script;
      if (0x1c < (script->super_CScriptBase)._size) {
        pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      (pCVar5->super_CScriptBase)._union.direct[0] = 'A';
      pCVar5 = script;
      if (0x1c < (script->super_CScriptBase)._size) {
        pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      memcpy((void *)((long)&(pCVar5->super_CScriptBase)._union + 1),&pubkey,0x41);
      if (0x1c < (script->super_CScriptBase)._size) {
        script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      script[2].super_CScriptBase._union.direct[2] = -0x54;
    }
    goto LAB_00a6af9a;
  default:
    bVar4 = false;
    goto LAB_00a6af9a;
  }
  bVar4 = true;
LAB_00a6af9a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool DecompressScript(CScript& script, unsigned int nSize, const CompressedScript& in)
{
    switch(nSize) {
    case 0x00:
        script.resize(25);
        script[0] = OP_DUP;
        script[1] = OP_HASH160;
        script[2] = 20;
        memcpy(&script[3], in.data(), 20);
        script[23] = OP_EQUALVERIFY;
        script[24] = OP_CHECKSIG;
        return true;
    case 0x01:
        script.resize(23);
        script[0] = OP_HASH160;
        script[1] = 20;
        memcpy(&script[2], in.data(), 20);
        script[22] = OP_EQUAL;
        return true;
    case 0x02:
    case 0x03:
        script.resize(35);
        script[0] = 33;
        script[1] = nSize;
        memcpy(&script[2], in.data(), 32);
        script[34] = OP_CHECKSIG;
        return true;
    case 0x04:
    case 0x05:
        unsigned char vch[33] = {};
        vch[0] = nSize - 2;
        memcpy(&vch[1], in.data(), 32);
        CPubKey pubkey{vch};
        if (!pubkey.Decompress())
            return false;
        assert(pubkey.size() == 65);
        script.resize(67);
        script[0] = 65;
        memcpy(&script[1], pubkey.begin(), 65);
        script[66] = OP_CHECKSIG;
        return true;
    }
    return false;
}